

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<const_kj::ReadableDirectory_*>::setCapacity
          (Vector<const_kj::ReadableDirectory_*> *this,size_t newSize)

{
  ReadableDirectory **ppRVar1;
  ReadableDirectory **ppRVar2;
  RemoveConst<const_kj::ReadableDirectory_*> *ppRVar3;
  ulong __n;
  ArrayBuilder<const_kj::ReadableDirectory_*> local_38;
  
  ppRVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppRVar1 >> 3)) {
    (this->builder).pos = ppRVar1 + newSize;
  }
  local_38.pos = (RemoveConst<const_kj::ReadableDirectory_*> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  ppRVar1 = (this->builder).ptr;
  ppRVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (ppRVar1 != ppRVar2) {
    __n = (long)ppRVar2 - (long)ppRVar1 & 0xfffffffffffffff8;
    memcpy(local_38.pos,ppRVar1,__n);
    local_38.pos = (RemoveConst<const_kj::ReadableDirectory_*> *)((long)local_38.pos + __n);
  }
  ArrayBuilder<const_kj::ReadableDirectory_*>::operator=(&this->builder,&local_38);
  ppRVar2 = local_38.endPtr;
  ppRVar3 = local_38.pos;
  ppRVar1 = local_38.ptr;
  if (local_38.ptr != (ReadableDirectory **)0x0) {
    local_38.ptr = (ReadableDirectory **)0x0;
    local_38.pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
    local_38.endPtr = (ReadableDirectory **)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,ppRVar1,8,(long)ppRVar3 - (long)ppRVar1 >> 3,
               (long)ppRVar2 - (long)ppRVar1 >> 3,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }